

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket.c
# Opt level: O0

void rotate(uint8_t *mask,uint_fast8_t middle)

{
  undefined1 local_13;
  undefined1 local_12;
  undefined1 local_11;
  uint_fast8_t next;
  uint_fast8_t first;
  uint_fast8_t middle_local;
  uint8_t *mask_local;
  
  local_12 = 0;
  local_13 = middle;
  local_11 = middle;
  while (local_12 != local_13) {
    swap(mask,local_12,local_13);
    local_12 = local_12 + 1;
    local_13 = local_13 + 1;
    if (local_13 < 4) {
      if (local_12 == local_11) {
        local_11 = local_13;
      }
    }
    else {
      local_13 = local_11;
    }
  }
  return;
}

Assistant:

static inline void rotate(uint8_t *mask, uint_fast8_t middle)
{
	uint_fast8_t first = 0;
	uint_fast8_t next = middle;

	while (first != next) {
		swap(mask, first, next);
		first++;
		next++;
		if (next >= 4) {
			next = middle;
		} else if (first == middle) {
			middle = next;
		}
	}
}